

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O1

int fl_parse_color(char *p,uchar *r,uchar *g,uchar *b)

{
  int iVar1;
  XColor x;
  undefined1 auStack_38 [9];
  uchar local_2f;
  uchar local_2d;
  uchar local_2b;
  
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  iVar1 = XParseColor(fl_display,fl_colormap,p,auStack_38);
  if (iVar1 != 0) {
    *r = local_2f;
    *g = local_2d;
    *b = local_2b;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int fl_parse_color(const char* p, uchar& r, uchar& g, uchar& b) {
  XColor x;
  if (!fl_display) fl_open_display();
  if (XParseColor(fl_display, fl_colormap, p, &x)) {
    r = (uchar)(x.red>>8);
    g = (uchar)(x.green>>8);
    b = (uchar)(x.blue>>8);
    return 1;
  } else return 0;
}